

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

void standard_ok_method_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value local_50;
  Am_Object local_40;
  Am_Value *local_38;
  Am_Value *v;
  Am_Object window;
  Am_Object local_18;
  Am_Object widget;
  Am_Object *cmd_local;
  
  widget.data = (Am_Object_Data *)cmd;
  pAVar2 = Am_Object::Get(cmd,0x170,0);
  Am_Object::Am_Object(&local_18,pAVar2);
  bVar1 = Am_Object::Valid(&local_18);
  if (!bVar1) {
    Am_Error("Lost widget");
  }
  pAVar2 = Am_Object::Get(&local_18,0x68,0);
  Am_Object::Am_Object((Am_Object *)&v,pAVar2);
  bVar1 = Am_Object::Valid((Am_Object *)&v);
  if (!bVar1) {
    Am_Error("Lost window");
  }
  local_38 = Am_Object::Get(cmd,0x169,0);
  Am_Object::Am_Object(&local_40,(Am_Object *)&v);
  Am_Value::Am_Value(&local_50,local_38);
  Am_Finish_Pop_Up_Waiting(&local_40,&local_50);
  Am_Value::~Am_Value(&local_50);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object((Am_Object *)&v);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, standard_ok_method, (Am_Object cmd))
{
  Am_Object widget = cmd.Get(Am_SAVED_OLD_OWNER);
  if (!widget.Valid())
    Am_Error("Lost widget");
  Am_Object window = widget.Get(Am_WINDOW);
  if (!window.Valid())
    Am_Error("Lost window");
  const Am_Value& v = cmd.Get(Am_VALUE);
  Am_Finish_Pop_Up_Waiting(window, v);
}